

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImBezierClosestPoint(ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImVec2 *p,int num_segments)

{
  ImVec2 *in_RCX;
  undefined8 *in_RDI;
  ImVec2 *in_R8;
  int in_R9D;
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  float dist2;
  ImVec2 p_line;
  ImVec2 p_current;
  int i_step;
  float t_step;
  float p_closest_dist2;
  ImVec2 p_last;
  ImVec2 p_closest;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  ImVec2 in_stack_ffffffffffffffa8;
  ImVec2 in_stack_ffffffffffffffb0;
  int iVar4;
  float fVar5;
  float fVar6;
  ImVec2 local_8;
  
  if (0 < in_R9D) {
    fVar2 = (float)*in_RDI;
    fVar6 = (float)((ulong)*in_RDI >> 0x20);
    ImVec2::ImVec2(&local_8);
    fVar5 = 3.4028235e+38;
    fVar1 = 1.0 / (float)in_R9D;
    for (iVar4 = 1; iVar4 <= in_R9D; iVar4 = iVar4 + 1) {
      in_stack_ffffffffffffffb0 =
           ImBezierCalc((ImVec2 *)CONCAT44(in_R9D,fVar6),(ImVec2 *)CONCAT44(fVar2,fVar5),
                        (ImVec2 *)CONCAT44(fVar1,iVar4),(ImVec2 *)in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8.y);
      in_stack_ffffffffffffffa8 = ImLineClosestPoint(in_RCX,in_R8,(ImVec2 *)CONCAT44(in_R9D,fVar6));
      IVar3 = operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        (ImVec2 *)0x16fe55);
      in_stack_ffffffffffffff9c = IVar3.x;
      fVar2 = ImLengthSqr((ImVec2 *)&stack0xffffffffffffff9c);
      if (fVar2 < fVar5) {
        fVar5 = fVar2;
        local_8 = in_stack_ffffffffffffffa8;
      }
      fVar2 = in_stack_ffffffffffffffb0.x;
      fVar6 = in_stack_ffffffffffffffb0.y;
    }
    return local_8;
  }
  __assert_fail("num_segments > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                ,0x4b0,
                "ImVec2 ImBezierClosestPoint(const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, int)"
               );
}

Assistant:

ImVec2 ImBezierClosestPoint(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& p, int num_segments)
{
    IM_ASSERT(num_segments > 0); // Use ImBezierClosestPointCasteljau()
    ImVec2 p_last = p1;
    ImVec2 p_closest;
    float p_closest_dist2 = FLT_MAX;
    float t_step = 1.0f / (float)num_segments;
    for (int i_step = 1; i_step <= num_segments; i_step++)
    {
        ImVec2 p_current = ImBezierCalc(p1, p2, p3, p4, t_step * i_step);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    return p_closest;
}